

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O1

int __thiscall gl4cts::TextureFilterMinmax::init(TextureFilterMinmax *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TextureFilterMinmaxParameterQueriesTestCase *this_00;
  TextureFilterMinmaxFilteringTestCaseBase *pTVar1;
  TextureFilterMinmaxSupportTestCase *this_01;
  
  this_00 = (TextureFilterMinmaxParameterQueriesTestCase *)operator_new(0xc0);
  TextureFilterMinmaxParameterQueriesTestCase::TextureFilterMinmaxParameterQueriesTestCase
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TextureFilterMinmaxFilteringTestCaseBase *)operator_new(200);
  TextureFilterMinmaxFilteringTestCaseBase::TextureFilterMinmaxFilteringTestCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,"TextureFilterMinmaxMinificationFiltering"
             ,"Implements minification filtering tests described in CTS_ARB_texture_filter_minmax",
             0.57,false);
  (pTVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureFilterMinmaxFilteringTestCaseBase_02131730;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureFilterMinmaxFilteringTestCaseBase *)operator_new(200);
  TextureFilterMinmaxFilteringTestCaseBase::TextureFilterMinmaxFilteringTestCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "TextureFilterMinmaxMagnificationFiltering",
             "Implements magnification filtering tests described in CTS_ARB_texture_filter_minmax",
             1.63,false);
  (pTVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureFilterMinmaxFilteringTestCaseBase_02131768;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TextureFilterMinmaxFilteringTestCaseBase *)operator_new(200);
  TextureFilterMinmaxFilteringTestCaseBase::TextureFilterMinmaxFilteringTestCaseBase
            (pTVar1,(this->super_TestCaseGroup).m_context,
             "TextureFilterMinmaxMipmapMinificationFiltering",
             "Implements mipmap minification filtering tests described in CTS_ARB_texture_filter_minmax"
             ,0.57,true);
  (pTVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureFilterMinmaxFilteringTestCaseBase_021317a0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  this_01 = (TextureFilterMinmaxSupportTestCase *)operator_new(0xc0);
  TextureFilterMinmaxSupportTestCase::TextureFilterMinmaxSupportTestCase
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void TextureFilterMinmax::init()
{
	addChild(new TextureFilterMinmaxParameterQueriesTestCase(m_context));
	addChild(new TextureFilterMinmaxMinificationFilteringTestCase(m_context));
	addChild(new TextureFilterMinmaxMagnificationFilteringTestCase(m_context));
	addChild(new TextureFilterMinmaxMipmapMinificationFilteringTestCase(m_context));
	addChild(new TextureFilterMinmaxSupportTestCase(m_context));
}